

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O3

void __thiscall
PenguinV_Image::ImageTemplate<float>::resize
          (ImageTemplate<float> *this,uint32_t width_,uint32_t height_)

{
  byte bVar1;
  FunctionFacade *data;
  _func_float_ptr_unsigned_long *p_Var2;
  float *pfVar3;
  uint32_t uVar4;
  
  if ((height_ != 0 && width_ != 0) && ((this->_width != width_ || (this->_height != height_)))) {
    clear(this);
    this->_width = width_;
    this->_height = height_;
    uVar4 = this->_colorCount * width_;
    this->_rowSize = uVar4;
    bVar1 = this->_alignment;
    if (uVar4 % (uint)bVar1 != 0) {
      uVar4 = (uVar4 / bVar1 + 1) * (uint)bVar1;
      this->_rowSize = uVar4;
    }
    data = FunctionFacade::instance();
    p_Var2 = __PenguinV_Image__ImageTemplate<float>__FunctionFacade___getFunction<float*(*)(unsigned_long)>_std__vector<float*(*)(unsigned_long),std::allocator<float*(*)(unsigned_long)>>const__unsigned_char_const_
                       (data,&data->_allocate,this->_type);
    pfVar3 = (*p_Var2)((long)uVar4 * (long)height_);
    this->_data = pfVar3;
  }
  return;
}

Assistant:

void resize( uint32_t width_, uint32_t height_ )
        {
            if( width_ > 0 && height_ > 0 && (width_ != _width || height_ != _height) ) {
                clear();

                _width  = width_;
                _height = height_;

                _rowSize = width() * colorCount();
                if( _rowSize % alignment() != 0 )
                    _rowSize = (_rowSize / alignment() + 1) * alignment();

                _data = _allocate( _height * _rowSize );
            }
        }